

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_job_help.hh
# Opt level: O0

void add_help_3(QPDFArgParser *ap)

{
  QPDFArgParser *pQVar1;
  allocator<char> local_bf9;
  string local_bf8;
  allocator<char> local_bd1;
  string local_bd0;
  allocator<char> local_ba9;
  string local_ba8;
  allocator<char> local_b81;
  string local_b80;
  allocator<char> local_b59;
  string local_b58;
  allocator<char> local_b31;
  string local_b30;
  allocator<char> local_b09;
  string local_b08;
  allocator<char> local_ae1;
  string local_ae0;
  allocator<char> local_ab9;
  string local_ab8;
  allocator<char> local_a91;
  string local_a90;
  allocator<char> local_a69;
  string local_a68;
  allocator<char> local_a41;
  string local_a40;
  allocator<char> local_a19;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  allocator<char> local_979;
  string local_978;
  allocator<char> local_951;
  string local_950;
  allocator<char> local_929;
  string local_928;
  allocator<char> local_901;
  string local_900;
  allocator<char> local_8d9;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  allocator<char> local_861;
  string local_860;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  QPDFArgParser *local_10;
  QPDFArgParser *ap_local;
  
  local_10 = ap;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"--encryption-file-password",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transformation",&local_69)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"supply password for --copy-encryption",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "--encryption-file-password=password\n\nIf the file named in --copy-encryption requires a password, use\nthis option to supply the password.\n"
             ,&local_b9);
  QPDFArgParser::addOptionHelp(ap,&local_30,&local_68,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"--qdf",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"transformation",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"enable viewing PDF code in a text editor",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,
             "Create a PDF file suitable for viewing in a text editor and even\nediting. This is for editing the PDF code, not the page contents.\nAll streams that can be uncompressed are uncompressed, and\ncontent streams are normalized, among other changes. The\ncompanion tool \"fix-qdf\" can be used to repair hand-edited QDF\nfiles. QDF is a feature specific to the qpdf tool. Please see\nthe \"QDF Mode\" chapter in the manual.\n"
             ,&local_159);
  QPDFArgParser::addOptionHelp(pQVar1,&local_e0,&local_108,&local_130,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"--no-original-object-ids",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"transformation",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"omit original object IDs in qdf",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,
             "Omit comments in a QDF file indicating the object ID an object\nhad in the original file.\n"
             ,&local_1f9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_180,&local_1a8,&local_1d0,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"--compress-streams",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"transformation",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"compress uncompressed streams",&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,
             "--compress-streams=[y|n]\n\nSetting --compress-streams=n prevents qpdf from compressing\nuncompressed streams. This can be useful if you are leaving some\nstreams uncompressed intentionally.\n"
             ,&local_299);
  QPDFArgParser::addOptionHelp(pQVar1,&local_220,&local_248,&local_270,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"--decode-level",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"transformation",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"control which streams to uncompress",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,
             "--decode-level=parameter\n\nWhen uncompressing streams, control which types of compression\nschemes should be uncompressed:\n- none: don\'t uncompress anything. This is the default with\n  --json-output.\n- generalized: uncompress streams compressed with a\n  general-purpose compression algorithm. This is the default\n  except when --json-output is given.\n- specialized: in addition to generalized, also uncompress\n  streams compressed with a special-purpose but non-lossy\n  compression scheme\n- all: in addition to specialized, uncompress streams compressed\n  with lossy compression schemes like JPEG (DCT)\nqpdf does not know how to uncompress all compression schemes.\n"
             ,&local_339);
  QPDFArgParser::addOptionHelp(pQVar1,&local_2c0,&local_2e8,&local_310,&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"--stream-data",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"transformation",&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"control stream compression",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,
             "--stream-data=parameter\n\nThis option controls how streams are compressed in the output.\nIt is less granular than the newer options, --compress-streams\nand --decode-level.\n\nParameters:\n- compress: same as --compress-streams=y --decode-level=generalized\n- preserve: same as --compress-streams=n --decode-level=none\n- uncompress: same as --compress-streams=n --decode-level=generalized\n"
             ,&local_3d9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_360,&local_388,&local_3b0,&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"--recompress-flate",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"transformation",&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"uncompress and recompress flate",&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,
             "The default generalized compression scheme used by PDF is flate,\nwhich is the same as used by zip and gzip. Usually qpdf just\nleaves these alone. This option tells qpdf to uncompress and\nrecompress streams compressed with flate. This can be useful\nwhen combined with --compression-level.\n"
             ,&local_479);
  QPDFArgParser::addOptionHelp(pQVar1,&local_400,&local_428,&local_450,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"--compression-level",&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"transformation",&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"set compression level for flate",&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,
             "--compression-level=level\n\nSet a compression level from 1 (least, fastest) to 9 (most,\nslowest) when compressing files with flate (used in zip and\ngzip), which is the default compression for most PDF files.\nYou need --recompress-flate with this option if you want to\nchange already compressed streams.\n"
             ,&local_519);
  QPDFArgParser::addOptionHelp(pQVar1,&local_4a0,&local_4c8,&local_4f0,&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"--jpeg-quality",&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"transformation",&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,"set jpeg quality level for jpeg",&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,
             "--jpeg-quality=level\n\nWhen rewriting images with --optimize-images, set a quality\nlevel from 0 (lowest) to 100 (highest) for writing new images.\nHigher quality results in larger images, and lower quality\nresults in smaller images. This option is only effective when\ncombined with --optimize-images.\n"
             ,&local_5b9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_540,&local_568,&local_590,&local_5b8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e0,"--normalize-content",&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"transformation",&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"fix newlines in content streams",&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,
             "--normalize-content=[y|n]\n\nNormalize newlines to UNIX-style newlines in PDF content\nstreams, which is useful for viewing them in a programmer\'s text\neditor across multiple platforms. This is also turned on by\n--qdf.\n"
             ,&local_659);
  QPDFArgParser::addOptionHelp(pQVar1,&local_5e0,&local_608,&local_630,&local_658);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_680,"--object-streams",&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"transformation",&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,"control use of object streams",&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,
             "--object-streams=mode\n\nControl what qpdf does regarding object streams. Options:\n- preserve: preserve original object streams, if any (the default)\n- disable: create output files with no object streams\n- generate: create object streams, and compress objects when possible\n"
             ,&local_6f9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_680,&local_6a8,&local_6d0,&local_6f8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"--preserve-unreferenced",&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"transformation",&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"preserve unreferenced objects",&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,"Preserve all objects from the input even if not referenced.\n",
             &local_799);
  QPDFArgParser::addOptionHelp(pQVar1,&local_720,&local_748,&local_770,&local_798);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c0,"--remove-unreferenced-resources",&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"transformation",&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_810,"remove unreferenced page resources",&local_811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_838,
             "--remove-unreferenced-resources=parameter\n\nRemove from a page\'s resource dictionary any resources that are\nnot referenced in the page\'s contents. Parameters: \"auto\"\n(default), \"yes\", \"no\".\n"
             ,&local_839);
  QPDFArgParser::addOptionHelp(pQVar1,&local_7c0,&local_7e8,&local_810,&local_838);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_860,"--preserve-unreferenced-resources",&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"transformation",&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b0,"use --remove-unreferenced-resources=no",&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d8,
             "Synonym for --remove-unreferenced-resources=no. Use that instead.\n",&local_8d9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_860,&local_888,&local_8b0,&local_8d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator(&local_861);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_900,"--newline-before-endstream",&local_901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_928,"transformation",&local_929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_950,"force a newline before endstream",&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_978,
             "For an extra newline before endstream. Using this option enables\nqpdf to preserve PDF/A when rewriting such files.\n"
             ,&local_979);
  QPDFArgParser::addOptionHelp(pQVar1,&local_900,&local_928,&local_950,&local_978);
  std::__cxx11::string::~string((string *)&local_978);
  std::allocator<char>::~allocator(&local_979);
  std::__cxx11::string::~string((string *)&local_950);
  std::allocator<char>::~allocator(&local_951);
  std::__cxx11::string::~string((string *)&local_928);
  std::allocator<char>::~allocator(&local_929);
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator(&local_901);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a0,"--coalesce-contents",&local_9a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c8,"transformation",&local_9c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,"combine content streams",&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a18,
             "If a page has an array of content streams, concatenate them into\na single content stream.\n"
             ,&local_a19);
  QPDFArgParser::addOptionHelp(pQVar1,&local_9a0,&local_9c8,&local_9f0,&local_a18);
  std::__cxx11::string::~string((string *)&local_a18);
  std::allocator<char>::~allocator(&local_a19);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::allocator<char>::~allocator(&local_9c9);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a40,"--externalize-inline-images",&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a68,"transformation",&local_a69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a90,"convert inline to regular images",&local_a91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab8,"Convert inline images to regular images.\n",&local_ab9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_a40,&local_a68,&local_a90,&local_ab8);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator(&local_ab9);
  std::__cxx11::string::~string((string *)&local_a90);
  std::allocator<char>::~allocator(&local_a91);
  std::__cxx11::string::~string((string *)&local_a68);
  std::allocator<char>::~allocator(&local_a69);
  std::__cxx11::string::~string((string *)&local_a40);
  std::allocator<char>::~allocator(&local_a41);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ae0,"--ii-min-bytes",&local_ae1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b08,"transformation",&local_b09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b30,"set minimum size for --externalize-inline-images",&local_b31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b58,
             "--ii-min-bytes=size-in-bytes\n\nDon\'t externalize inline images smaller than this size. The\ndefault is 1,024. Use 0 for no minimum.\n"
             ,&local_b59);
  QPDFArgParser::addOptionHelp(pQVar1,&local_ae0,&local_b08,&local_b30,&local_b58);
  std::__cxx11::string::~string((string *)&local_b58);
  std::allocator<char>::~allocator(&local_b59);
  std::__cxx11::string::~string((string *)&local_b30);
  std::allocator<char>::~allocator(&local_b31);
  std::__cxx11::string::~string((string *)&local_b08);
  std::allocator<char>::~allocator(&local_b09);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::allocator<char>::~allocator(&local_ae1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b80,"--min-version",&local_b81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ba8,"transformation",&local_ba9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bd0,"set minimum PDF version",&local_bd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bf8,
             "--min-version=version\n\nForce the PDF version of the output to be at least the specified\nversion. The version number format is\n\"major.minor[.extension-level]\", which sets the version header\nto \"major.minor\" and the extension level, if specified, to\n\"extension-level\".\n"
             ,&local_bf9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_b80,&local_ba8,&local_bd0,&local_bf8);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::allocator<char>::~allocator(&local_bf9);
  std::__cxx11::string::~string((string *)&local_bd0);
  std::allocator<char>::~allocator(&local_bd1);
  std::__cxx11::string::~string((string *)&local_ba8);
  std::allocator<char>::~allocator(&local_ba9);
  std::__cxx11::string::~string((string *)&local_b80);
  std::allocator<char>::~allocator(&local_b81);
  return;
}

Assistant:

static void add_help_3(QPDFArgParser& ap)
{
ap.addOptionHelp("--encryption-file-password", "transformation", "supply password for --copy-encryption", R"(--encryption-file-password=password

If the file named in --copy-encryption requires a password, use
this option to supply the password.
)");
ap.addOptionHelp("--qdf", "transformation", "enable viewing PDF code in a text editor", R"(Create a PDF file suitable for viewing in a text editor and even
editing. This is for editing the PDF code, not the page contents.
All streams that can be uncompressed are uncompressed, and
content streams are normalized, among other changes. The
companion tool "fix-qdf" can be used to repair hand-edited QDF
files. QDF is a feature specific to the qpdf tool. Please see
the "QDF Mode" chapter in the manual.
)");
ap.addOptionHelp("--no-original-object-ids", "transformation", "omit original object IDs in qdf", R"(Omit comments in a QDF file indicating the object ID an object
had in the original file.
)");
ap.addOptionHelp("--compress-streams", "transformation", "compress uncompressed streams", R"(--compress-streams=[y|n]

Setting --compress-streams=n prevents qpdf from compressing
uncompressed streams. This can be useful if you are leaving some
streams uncompressed intentionally.
)");
ap.addOptionHelp("--decode-level", "transformation", "control which streams to uncompress", R"(--decode-level=parameter

When uncompressing streams, control which types of compression
schemes should be uncompressed:
- none: don't uncompress anything. This is the default with
  --json-output.
- generalized: uncompress streams compressed with a
  general-purpose compression algorithm. This is the default
  except when --json-output is given.
- specialized: in addition to generalized, also uncompress
  streams compressed with a special-purpose but non-lossy
  compression scheme
- all: in addition to specialized, uncompress streams compressed
  with lossy compression schemes like JPEG (DCT)
qpdf does not know how to uncompress all compression schemes.
)");
ap.addOptionHelp("--stream-data", "transformation", "control stream compression", R"(--stream-data=parameter

This option controls how streams are compressed in the output.
It is less granular than the newer options, --compress-streams
and --decode-level.

Parameters:
- compress: same as --compress-streams=y --decode-level=generalized
- preserve: same as --compress-streams=n --decode-level=none
- uncompress: same as --compress-streams=n --decode-level=generalized
)");
ap.addOptionHelp("--recompress-flate", "transformation", "uncompress and recompress flate", R"(The default generalized compression scheme used by PDF is flate,
which is the same as used by zip and gzip. Usually qpdf just
leaves these alone. This option tells qpdf to uncompress and
recompress streams compressed with flate. This can be useful
when combined with --compression-level.
)");
ap.addOptionHelp("--compression-level", "transformation", "set compression level for flate", R"(--compression-level=level

Set a compression level from 1 (least, fastest) to 9 (most,
slowest) when compressing files with flate (used in zip and
gzip), which is the default compression for most PDF files.
You need --recompress-flate with this option if you want to
change already compressed streams.
)");
ap.addOptionHelp("--jpeg-quality", "transformation", "set jpeg quality level for jpeg", R"(--jpeg-quality=level

When rewriting images with --optimize-images, set a quality
level from 0 (lowest) to 100 (highest) for writing new images.
Higher quality results in larger images, and lower quality
results in smaller images. This option is only effective when
combined with --optimize-images.
)");
ap.addOptionHelp("--normalize-content", "transformation", "fix newlines in content streams", R"(--normalize-content=[y|n]

Normalize newlines to UNIX-style newlines in PDF content
streams, which is useful for viewing them in a programmer's text
editor across multiple platforms. This is also turned on by
--qdf.
)");
ap.addOptionHelp("--object-streams", "transformation", "control use of object streams", R"(--object-streams=mode

Control what qpdf does regarding object streams. Options:
- preserve: preserve original object streams, if any (the default)
- disable: create output files with no object streams
- generate: create object streams, and compress objects when possible
)");
ap.addOptionHelp("--preserve-unreferenced", "transformation", "preserve unreferenced objects", R"(Preserve all objects from the input even if not referenced.
)");
ap.addOptionHelp("--remove-unreferenced-resources", "transformation", "remove unreferenced page resources", R"(--remove-unreferenced-resources=parameter

Remove from a page's resource dictionary any resources that are
not referenced in the page's contents. Parameters: "auto"
(default), "yes", "no".
)");
ap.addOptionHelp("--preserve-unreferenced-resources", "transformation", "use --remove-unreferenced-resources=no", R"(Synonym for --remove-unreferenced-resources=no. Use that instead.
)");
ap.addOptionHelp("--newline-before-endstream", "transformation", "force a newline before endstream", R"(For an extra newline before endstream. Using this option enables
qpdf to preserve PDF/A when rewriting such files.
)");
ap.addOptionHelp("--coalesce-contents", "transformation", "combine content streams", R"(If a page has an array of content streams, concatenate them into
a single content stream.
)");
ap.addOptionHelp("--externalize-inline-images", "transformation", "convert inline to regular images", R"(Convert inline images to regular images.
)");
ap.addOptionHelp("--ii-min-bytes", "transformation", "set minimum size for --externalize-inline-images", R"(--ii-min-bytes=size-in-bytes

Don't externalize inline images smaller than this size. The
default is 1,024. Use 0 for no minimum.
)");
ap.addOptionHelp("--min-version", "transformation", "set minimum PDF version", R"(--min-version=version

Force the PDF version of the output to be at least the specified
version. The version number format is
"major.minor[.extension-level]", which sets the version header
to "major.minor" and the extension level, if specified, to
"extension-level".
)");
}